

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_lr_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  RK_S32 RVar4;
  long lVar5;
  AV1RawSequenceHeader *pAVar6;
  RK_U32 value;
  RK_U8 local_3c [4];
  AV1RawSequenceHeader *local_38;
  
  RVar4 = 0;
  if (((ctx->all_lossless == 0) && (RVar4 = 0, current->allow_intrabc == '\0')) &&
     (pAVar6 = ctx->sequence_header, pAVar6->enable_restoration != '\0')) {
    if (ctx->num_planes < 1) {
      bVar2 = true;
      bVar1 = 0;
    }
    else {
      lVar5 = 0;
      bVar1 = 0;
      bVar2 = false;
      local_38 = pAVar6;
      do {
        RVar4 = mpp_av1_read_unsigned(gb,2,"lr_type[i]",(RK_U32 *)local_3c,0,3);
        if (RVar4 < 0) goto LAB_001c70c7;
        bVar3 = bVar1;
        if (local_3c[0] != '\0') {
          bVar2 = true;
          bVar3 = 1;
        }
        if (lVar5 != 0) {
          bVar1 = bVar3;
        }
        current->lr_type[lVar5] = local_3c[0];
        lVar5 = lVar5 + 1;
      } while (lVar5 < ctx->num_planes);
      bVar2 = !bVar2;
      pAVar6 = local_38;
    }
    RVar4 = 0;
    if (!bVar2) {
      RVar4 = mpp_av1_read_increment
                        (gb,(uint)(pAVar6->use_128x128_superblock != '\0'),2,"lr_unit_shift",
                         (RK_U32 *)local_3c);
      if (-1 < RVar4) {
        current->lr_unit_shift = local_3c[0];
        if (((pAVar6->color_config).subsampling_x == '\0') ||
           (!(bool)((pAVar6->color_config).subsampling_y != '\0' & bVar1))) {
          current->lr_uv_shift = '\0';
          return 0;
        }
        RVar4 = mpp_av1_read_unsigned(gb,1,"lr_uv_shift",(RK_U32 *)local_3c,0,1);
        if (-1 < RVar4) {
          current->lr_uv_shift = local_3c[0];
          return 0;
        }
      }
LAB_001c70c7:
      RVar4 = -1;
    }
  }
  return RVar4;
}

Assistant:

static RK_S32 mpp_av1_lr_params(AV1Context *ctx, BitReadCtx_t *gb,
                                AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 uses_lr,  uses_chroma_lr;
    RK_S32 i, err;

    if (ctx->all_lossless || current->allow_intrabc ||
        !seq->enable_restoration) {
        return 0;
    }

    uses_lr = uses_chroma_lr = 0;
    for (i = 0; i < ctx->num_planes; i++) {
        fbs(2, lr_type[i], 1, i);

        if (current->lr_type[i] != AV1_RESTORE_NONE) {
            uses_lr = 1;
            if (i > 0)
                uses_chroma_lr = 1;
        }
    }

    if (uses_lr) {
        if (seq->use_128x128_superblock)
            increment(lr_unit_shift, 1, 2);
        else
            increment(lr_unit_shift, 0, 2);

        if (seq->color_config.subsampling_x &&
            seq->color_config.subsampling_y && uses_chroma_lr) {
            fb(1, lr_uv_shift);
        } else {
            infer(lr_uv_shift, 0);
        }
    }

    return 0;
}